

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O2

int Res_FilterCandidatesArea
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  Abc_Obj_t *pAVar9;
  uint *puVar10;
  void *pvVar11;
  uint *r;
  int CostMax;
  ulong uVar12;
  int i;
  ulong uVar13;
  
  puVar8 = (uint *)Vec_PtrEntry(pSim->vOuts,1);
  iVar4 = Abc_InfoIsOne(puVar8,pSim->nWordsOut);
  iVar5 = 0;
  if (iVar4 != 0) {
    uVar12 = 0xffffffffffffffff;
    puVar8 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
    iVar4 = Abc_InfoIsOne(puVar8,pSim->nWordsOut);
    if (iVar4 != 0) {
      Vec_VecClear(vResubs);
      Vec_VecClear(vResubsW);
      pAVar9 = pWin->pNode;
      iVar4 = 0;
      for (uVar13 = 0; (long)uVar13 < (long)(pAVar9->vFanins).nSize; uVar13 = uVar13 + 1) {
        pNode = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[uVar13]];
        if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanouts).nSize < 2)) {
          iVar5 = Res_WinVisitMffc(pNode);
          if (iVar4 < iVar5) {
            uVar12 = uVar13;
          }
          uVar12 = uVar12 & 0xffffffff;
          if (iVar4 <= iVar5) {
            iVar4 = iVar5;
          }
        }
      }
      if ((int)uVar12 == -1) {
        iVar5 = 0;
      }
      else {
        bVar3 = (byte)uVar12 & 0x1f;
        puVar8 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
        iVar4 = Abc_InfoIsOne(puVar8,pSim->nWordsOut);
        if (iVar4 == 0) {
          iVar5 = 0;
          for (iVar4 = (pWin->pNode->vFanins).nSize + 2; iVar4 < pAig->vPos->nSize;
              iVar4 = iVar4 + 1) {
            puVar10 = (uint *)Vec_PtrEntry(pSim->vOuts,iVar4);
            iVar1 = (pWin->pNode->vFanins).nSize;
            iVar6 = Abc_InfoIsOrOne(puVar8,puVar10,pSim->nWordsOut);
            if (iVar6 != 0) {
              pAVar9 = Abc_NtkPo(pAig,0);
              Vec_VecPush(vResubs,iVar5,pAVar9);
              pAVar9 = Abc_NtkPo(pAig,1);
              Vec_VecPush(vResubs,iVar5,pAVar9);
              for (uVar13 = 0; pAVar9 = pWin->pNode, (long)uVar13 < (long)(pAVar9->vFanins).nSize;
                  uVar13 = uVar13 + 1) {
                if ((uVar12 & 0xffffffff) != uVar13) {
                  pvVar11 = pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[uVar13]];
                  pAVar9 = Abc_NtkPo(pAig,(int)uVar13 + 2);
                  Vec_VecPush(vResubs,iVar5,pAVar9);
                  Vec_VecPush(vResubsW,iVar5,pvVar11);
                }
              }
              pAVar9 = Abc_NtkPo(pAig,iVar4);
              Vec_VecPush(vResubs,iVar5,pAVar9);
              pvVar11 = Vec_PtrEntry(pWin->vDivs,(iVar4 - iVar1) + -2);
              Vec_VecPush(vResubsW,iVar5,pvVar11);
              iVar5 = iVar5 + 1;
              if (iVar5 == vResubs->nSize) break;
            }
          }
          if ((iVar5 < 1) && (iVar4 = (pWin->pNode->vFanins).nSize, iVar4 < nFaninsMax)) {
            iVar4 = iVar4 + 2;
            while (iVar4 < pAig->vPos->nSize) {
              puVar10 = (uint *)Vec_PtrEntry(pSim->vOuts,iVar4);
              iVar1 = (pWin->pNode->vFanins).nSize;
              for (iVar6 = iVar4 + 1; iVar6 < pAig->vPos->nSize; iVar6 = iVar6 + 1) {
                r = (uint *)Vec_PtrEntry(pSim->vOuts,iVar6);
                iVar2 = (pWin->pNode->vFanins).nSize;
                iVar7 = Abc_InfoIsOrOne3(puVar8,puVar10,r,pSim->nWordsOut);
                if (iVar7 != 0) {
                  pAVar9 = Abc_NtkPo(pAig,0);
                  Vec_VecPush(vResubs,iVar5,pAVar9);
                  pAVar9 = Abc_NtkPo(pAig,1);
                  Vec_VecPush(vResubs,iVar5,pAVar9);
                  for (uVar13 = 0; pAVar9 = pWin->pNode,
                      (long)uVar13 < (long)(pAVar9->vFanins).nSize; uVar13 = uVar13 + 1) {
                    if ((uVar12 & 0xffffffff) != uVar13) {
                      pvVar11 = pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[uVar13]];
                      pAVar9 = Abc_NtkPo(pAig,(int)uVar13 + 2);
                      Vec_VecPush(vResubs,iVar5,pAVar9);
                      Vec_VecPush(vResubsW,iVar5,pvVar11);
                    }
                  }
                  pAVar9 = Abc_NtkPo(pAig,iVar4);
                  Vec_VecPush(vResubs,iVar5,pAVar9);
                  pAVar9 = Abc_NtkPo(pAig,iVar6);
                  Vec_VecPush(vResubs,iVar5,pAVar9);
                  pvVar11 = Vec_PtrEntry(pWin->vDivs,(iVar4 - iVar1) + -2);
                  Vec_VecPush(vResubsW,iVar5,pvVar11);
                  pvVar11 = Vec_PtrEntry(pWin->vDivs,(iVar6 - iVar2) + -2);
                  Vec_VecPush(vResubsW,iVar5,pvVar11);
                  iVar5 = iVar5 + 1;
                  if (iVar5 == vResubs->nSize) {
                    return iVar5;
                  }
                }
              }
              iVar4 = iVar4 + 1;
              if (iVar5 == vResubs->nSize) {
                return vResubs->nSize;
              }
            }
          }
        }
        else {
          pAVar9 = Abc_NtkPo(pAig,0);
          Vec_VecPush(vResubs,0,pAVar9);
          pAVar9 = Abc_NtkPo(pAig,1);
          Vec_VecPush(vResubs,0,pAVar9);
          for (uVar13 = 0; pAVar9 = pWin->pNode, (long)uVar13 < (long)(pAVar9->vFanins).nSize;
              uVar13 = uVar13 + 1) {
            if ((uVar12 & 0xffffffff) != uVar13) {
              pvVar11 = pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[uVar13]];
              pAVar9 = Abc_NtkPo(pAig,(int)uVar13 + 2);
              Vec_VecPush(vResubs,0,pAVar9);
              Vec_VecPush(vResubsW,0,pvVar11);
            }
          }
          iVar5 = 1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int Res_FilterCandidatesArea( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax )
{
    Abc_Obj_t * pFanin;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, d, d2, k, iDiv, iDiv2, iBest;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing fanins
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    // get the best fanins
    iBest = Res_FilterCriticalFanin( pWin->pNode );
    if ( iBest == -1 )
        return 0;

    // get the info without the critical fanin
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << iBest) );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue )
    {
//        printf( "Can be done without one!\n" );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        Counter++;
//        printf( "*" );
        return Counter;
    }

    // go through the divisors
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
            continue;
//if ( Abc_ObjLevel(pWin->pNode) <= Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) )
//    printf( "Node level = %d. Divisor level = %d.\n", Abc_ObjLevel(pWin->pNode), Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        // collect the remaning fanins and the divisor
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        // collect the divisor
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
        Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
        Counter++;

        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }

    if ( Counter > 0 || Abc_ObjFaninNum(pWin->pNode) >= nFaninsMax )
        return Counter;

    // try to find the node pairs
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        // go through the second divisor
        for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
        {
            pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
            iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);

            if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
            {
                if ( k != iBest )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFanin );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
            Counter++;

            if ( Counter == Vec_VecSize(vResubs) )
                break;            
        }
        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }
    return Counter;
}